

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect.c
# Opt level: O0

int log_aspect_reserve(log_aspect aspect,size_t size)

{
  size_t sVar1;
  void *pvVar2;
  size_t in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  sVar1 = log_valid_size(in_RSI);
  if ((sVar1 == 0) || (0x100 < sVar1)) {
    local_4 = 1;
  }
  else {
    if (*(long *)(in_RDI + 0x10) != 0) {
      free(*(void **)(in_RDI + 0x10));
    }
    pvVar2 = malloc(sVar1 << 3);
    *(void **)(in_RDI + 0x10) = pvVar2;
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_4 = 1;
    }
    else {
      *(undefined8 *)(in_RDI + 0x18) = 0;
      *(size_t *)(in_RDI + 0x20) = sVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int log_aspect_reserve(log_aspect aspect, size_t size)
{
	size = log_valid_size(size);

	if (size < LOG_ASPECT_POLICIES_MIN_SIZE || size > LOG_ASPECT_POLICIES_MAX_SIZE)
	{
		return 1;
	}

	if (aspect->policies != NULL)
	{
		free(aspect->policies);
	}

	aspect->policies = malloc(sizeof(log_policy) * size);

	if (aspect->policies == NULL)
	{
		return 1;
	}

	aspect->count = 0;
	aspect->size = size;

	return 0;
}